

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall
gss::innards::Proof::create_adjacency_constraint
          (Proof *this,int p,int q,int t,vector<int,_std::allocator<int>_> *uu,
          vector<int,_std::allocator<int>_> *cancel,bool param_6)

{
  int *piVar1;
  int *piVar2;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var3;
  pointer pcVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  size_type sVar8;
  pointer pcVar9;
  int *u;
  int *piVar10;
  long n_1;
  long n;
  stringstream adjacency_constraint_to_recover;
  stringstream adjacency_constraint_for_opb;
  int local_3ac;
  tuple<int,_int,_int,_int> local_3a8;
  tuple<long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_398;
  undefined1 local_368 [8];
  _Head_base<1UL,_int,_false> local_360;
  _Head_base<0UL,_int,_false> local_35c;
  long local_348;
  undefined1 local_340 [392];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  pcVar9 = (pointer)(long)p;
  sVar8 = (size_type)t;
  pcVar4 = (pointer)(long)q;
  if (((this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->recover_encoding ==
      false) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar5 = std::operator<<(local_1a8,"1 ~x");
    local_340._0_8_ = pcVar9;
    local_340._8_8_ = sVar8;
    pmVar6 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->variable_mappings,(key_type *)local_340);
    std::operator<<(poVar5,(string *)pmVar6);
    piVar1 = (uu->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    for (piVar10 = (uu->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start; piVar10 != piVar1; piVar10 = piVar10 + 1) {
      piVar2 = (cancel->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        ((cancel->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start,piVar2,piVar10);
      if (piVar2 == _Var7._M_current) {
        poVar5 = std::operator<<(local_1a8," 1 x");
        local_340._8_8_ = SEXT48(*piVar10);
        local_340._0_8_ = pcVar4;
        pmVar6 = std::
                 map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                               _M_head_impl)->variable_mappings,(key_type *)local_340);
        std::operator<<(poVar5,(string *)pmVar6);
      }
    }
    std::operator<<(local_1a8," >= 1");
    _Var3._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    local_3a8.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int> =
         (_Tuple_impl<2UL,_int,_int>)((_Var3._M_head_impl)->nb_constraints + 1);
    *(_Tuple_impl<2UL,_int,_int> *)&(_Var3._M_head_impl)->nb_constraints =
         local_3a8.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
         super__Tuple_impl<2UL,_int,_int>;
    local_35c._M_head_impl = 0;
    local_368._0_4_ = t;
    local_368._4_4_ = q;
    local_360._M_head_impl = p;
    std::__cxx11::stringbuf::str();
    std::
    tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    tuple<long_&,_long_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              ((tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_340,(long *)&local_3a8,(long *)&local_3a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_398);
    std::
    _Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
    ::_M_emplace_unique<std::tuple<int,int,int,int>,std::tuple<long,long,std::__cxx11::string>>
              ((_Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
                *)&(_Var3._M_head_impl)->adjacency_lines,(tuple<int,_int,_int,_int> *)local_368,
               (tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_340);
    std::__cxx11::string::~string((string *)local_340);
    std::__cxx11::string::~string((string *)&local_398);
    _Var3._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    std::__cxx11::stringbuf::str();
    poVar5 = std::operator<<((ostream *)&(_Var3._M_head_impl)->field_0x50,(string *)local_340);
    std::operator<<(poVar5," ;\n");
    std::__cxx11::string::~string((string *)local_340);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__cxx11::stringstream::stringstream((stringstream *)local_340);
    poVar5 = std::operator<<(local_1a8,"1 ~x");
    local_398.
    super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p = pcVar9;
    local_398.
    super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_string_length = sVar8;
    pmVar6 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->variable_mappings,(key_type *)&local_398);
    std::operator<<(poVar5,(string *)pmVar6);
    poVar5 = std::operator<<((ostream *)(local_340 + 0x10),"1 ~x");
    local_398.
    super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p = pcVar9;
    local_398.
    super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_string_length = sVar8;
    pmVar6 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->variable_mappings,(key_type *)&local_398);
    std::operator<<(poVar5,(string *)pmVar6);
    piVar1 = (uu->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    for (piVar10 = (uu->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start; piVar10 != piVar1; piVar10 = piVar10 + 1) {
      poVar5 = std::operator<<(local_1a8," 1 x");
      local_398.
      super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ._M_head_impl._M_string_length = (size_type)*piVar10;
      local_398.
      super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ._M_head_impl._M_dataplus._M_p = pcVar4;
      pmVar6 = std::
               map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                              .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl
                             )->variable_mappings,(key_type *)&local_398);
      std::operator<<(poVar5,(string *)pmVar6);
      piVar2 = (cancel->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        ((cancel->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start,piVar2,piVar10);
      if (piVar2 == _Var7._M_current) {
        poVar5 = std::operator<<((ostream *)(local_340 + 0x10)," 1 x");
        local_398.
        super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ._M_head_impl._M_string_length = (size_type)*piVar10;
        local_398.
        super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ._M_head_impl._M_dataplus._M_p = pcVar4;
        pmVar6 = std::
                 map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                               _M_head_impl)->variable_mappings,(key_type *)&local_398);
        std::operator<<(poVar5,(string *)pmVar6);
      }
    }
    std::operator<<(local_1a8," >= 1");
    std::operator<<((ostream *)(local_340 + 0x10)," >= 1");
    _Var3._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    local_348 = (_Var3._M_head_impl)->nb_constraints + 1;
    (_Var3._M_head_impl)->nb_constraints = local_348;
    local_3a8.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl = q;
    local_3a8.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
    _M_head_impl = (_Head_base<3UL,_int,_false>)(_Head_base<3UL,_int,_false>)t;
    local_3ac = 0;
    local_3a8.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
    _M_head_impl = 0;
    local_3a8.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
    super__Head_base<1UL,_int,_false>._M_head_impl = p;
    std::__cxx11::stringbuf::str();
    std::
    tuple<long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    tuple<long_&,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              (&local_398,&local_348,&local_3ac,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368);
    std::
    _Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
    ::_M_emplace_unique<std::tuple<int,int,int,int>,std::tuple<long,int,std::__cxx11::string>>
              ((_Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
                *)&(_Var3._M_head_impl)->adjacency_lines,&local_3a8,&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)local_368);
    _Var3._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    std::__cxx11::stringbuf::str();
    poVar5 = std::operator<<((ostream *)&(_Var3._M_head_impl)->field_0x50,(string *)&local_398);
    std::operator<<(poVar5," ;\n");
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

auto Proof::create_adjacency_constraint(int p, int q, int t, const vector<int> & uu, const vector<int> & cancel,
        bool) -> void
{
    if (! _imp->recover_encoding) {
        stringstream adjacency_constraint;
        adjacency_constraint << "1 ~x" << _imp->variable_mappings[pair{p, t}];
        for (auto & u : uu)
            if (cancel.end() == find(cancel.begin(), cancel.end(), u))
                adjacency_constraint << " 1 x" << _imp->variable_mappings[pair{q, u}];
        adjacency_constraint << " >= 1";
        long n = ++_imp->nb_constraints;
        _imp->adjacency_lines.emplace(tuple{0, p, q, t}, tuple{n, n, adjacency_constraint.str()});
        _imp->model_stream << adjacency_constraint.str() << " ;\n";
    }
    else {
        stringstream adjacency_constraint_for_opb, adjacency_constraint_to_recover;
        adjacency_constraint_for_opb << "1 ~x" << _imp->variable_mappings[pair{p, t}];
        adjacency_constraint_to_recover << "1 ~x" << _imp->variable_mappings[pair{p, t}];
        for (auto & u : uu) {
            adjacency_constraint_for_opb << " 1 x" << _imp->variable_mappings[pair{q, u}];
            if (cancel.end() == find(cancel.begin(), cancel.end(), u))
                adjacency_constraint_to_recover << " 1 x" << _imp->variable_mappings[pair{q, u}];
        }
        adjacency_constraint_for_opb << " >= 1";
        adjacency_constraint_to_recover << " >= 1";

        long n = ++_imp->nb_constraints;
        _imp->adjacency_lines.emplace(tuple{0, p, q, t}, tuple{n, 0, adjacency_constraint_to_recover.str()});
        _imp->model_stream << adjacency_constraint_for_opb.str() << " ;\n";
    }
}